

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Mapping.c
# Opt level: O0

arm64_reg AArch64_map_insn(char *name)

{
  arm64_reg local_18;
  arm64_reg local_14;
  int i;
  char *name_local;
  
  local_14 = name2id(insn_name_maps + 1,0x1a0,name);
  if (local_14 == ~ARM64_REG_INVALID) {
    local_14 = name2id(alias_insn_name_maps,0x2b,name);
  }
  if (local_14 == ~ARM64_REG_INVALID) {
    local_18 = ARM64_REG_INVALID;
  }
  else {
    local_18 = local_14;
  }
  return local_18;
}

Assistant:

arm64_reg AArch64_map_insn(const char *name)
{
	// NOTE: skip first NULL name in insn_name_maps
	int i = name2id(&insn_name_maps[1], ARR_SIZE(insn_name_maps) - 1, name);

	if (i == -1)
		// try again with 'special' insn that is not available in insn_name_maps
		i = name2id(alias_insn_name_maps, ARR_SIZE(alias_insn_name_maps), name);

	return (i != -1)? i : ARM64_REG_INVALID;
}